

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DeadBranchElimPass::GetConstInteger
          (DeadBranchElimPass *this,uint32_t selId,uint32_t *selVal)

{
  IRContext *pIVar1;
  uint32_t uVar2;
  Instruction *this_00;
  Instruction *this_01;
  uint32_t uVar3;
  
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = analysis::DefUseManager::GetDef
                      ((pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,selId);
  uVar3 = 0;
  if (this_00->has_type_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(this_00,0);
  }
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_01 = analysis::DefUseManager::GetDef
                      ((pIVar1->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar3);
  if ((this_01 == (Instruction *)0x0) || (this_01->opcode_ != OpTypeInt)) {
    uVar3 = 0;
  }
  else {
    uVar3 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar3 = (uint)this_01->has_result_id_;
    }
    uVar2 = Instruction::GetSingleWordOperand(this_01,uVar3);
    uVar3 = 0;
    if (uVar2 == 0x20) {
      if (this_00->opcode_ != OpConstantNull) {
        if (this_00->opcode_ != OpConstant) goto LAB_00589638;
        uVar3 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar3 = (uint)this_00->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(this_00,uVar3);
      }
      *selVal = uVar3;
      uVar3 = 1;
    }
  }
LAB_00589638:
  return SUB41(uVar3,0);
}

Assistant:

bool DeadBranchElimPass::GetConstInteger(uint32_t selId, uint32_t* selVal) {
  Instruction* sInst = get_def_use_mgr()->GetDef(selId);
  uint32_t typeId = sInst->type_id();
  Instruction* typeInst = get_def_use_mgr()->GetDef(typeId);
  if (!typeInst || (typeInst->opcode() != spv::Op::OpTypeInt)) return false;
  // TODO(greg-lunarg): Support non-32 bit ints
  if (typeInst->GetSingleWordInOperand(0) != 32) return false;
  if (sInst->opcode() == spv::Op::OpConstant) {
    *selVal = sInst->GetSingleWordInOperand(0);
    return true;
  } else if (sInst->opcode() == spv::Op::OpConstantNull) {
    *selVal = 0;
    return true;
  }
  return false;
}